

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void embree::SceneGraph::set_motion_vector(Ref<embree::SceneGraph::Node> *node,Vec3fa *dP)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Node *pNVar4;
  undefined8 uVar5;
  size_t sVar6;
  long *plVar7;
  Vec3fx *pVVar8;
  long lVar9;
  size_t i;
  float *pfVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Vec3fx *pVVar14;
  Vec3fa *P;
  float *pfVar15;
  Vec3fx *P_3;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> local_80;
  Vec3fa *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar4 = node->ptr;
  if (pNVar4 != (Node *)0x0) {
    plVar7 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar7 == (long *)0x0) {
      plVar7 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&GroupNode::typeinfo,0);
      if (plVar7 == (long *)0x0) {
        plVar7 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        local_60 = dP;
        if (plVar7 == (long *)0x0) {
          plVar7 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          if (plVar7 == (long *)0x0) {
            plVar7 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&GridMeshNode::typeinfo,0);
            if (plVar7 == (long *)0x0) {
              plVar7 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&HairSetNode::typeinfo,0);
              if (plVar7 == (long *)0x0) {
                plVar7 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&PointSetNode::typeinfo,0);
                if (plVar7 == (long *)0x0) {
                  plVar7 = (long *)__dynamic_cast(pNVar4,&Node::typeinfo,&SubdivMeshNode::typeinfo,0
                                                 );
                  if (plVar7 != (long *)0x0) {
                    (**(code **)(*plVar7 + 0x10))(plVar7);
                    local_80.size_active = 0;
                    local_80.size_alloced = 0;
                    local_80.items = (Vec3fx *)0x0;
                    pfVar15 = *(float **)(plVar7[0xf] + -8);
                    pfVar10 = pfVar15 + *(long *)(plVar7[0xf] + -0x18) * 4;
                    pVVar14 = (Vec3fx *)0x0;
                    uVar11 = 0;
                    for (; sVar6 = local_80.size_active, pfVar15 != pfVar10; pfVar15 = pfVar15 + 4)
                    {
                      local_58 = *pfVar15 + (dP->field_0).m128[0];
                      fStack_54 = pfVar15[1] + (dP->field_0).m128[1];
                      fStack_50 = pfVar15[2] + (dP->field_0).m128[2];
                      fStack_4c = pfVar15[3] + (dP->field_0).m128[3];
                      uVar1 = local_80.size_active + 1;
                      if (uVar11 < uVar1) {
                        uVar12 = uVar11;
                        uVar13 = uVar1;
                        if (uVar11 != 0) {
                          for (; uVar13 = uVar12, uVar12 < uVar1;
                              uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
                          }
                        }
                        if (uVar11 != uVar13) {
                          pVVar8 = (Vec3fx *)alignedMalloc(uVar13 << 4,0x10);
                          lVar9 = 0;
                          for (uVar11 = 0; uVar11 < sVar6; uVar11 = uVar11 + 1) {
                            puVar2 = (undefined8 *)((long)&pVVar14->field_0 + lVar9);
                            uVar5 = puVar2[1];
                            puVar3 = (undefined8 *)((long)&pVVar8->field_0 + lVar9);
                            *puVar3 = *puVar2;
                            puVar3[1] = uVar5;
                            lVar9 = lVar9 + 0x10;
                          }
                          local_80.items = pVVar8;
                          alignedFree(pVVar14);
                          uVar11 = uVar13;
                          pVVar14 = pVVar8;
                          local_80.size_alloced = uVar13;
                        }
                      }
                      *(ulong *)&pVVar14[sVar6].field_0 = CONCAT44(fStack_54,local_58);
                      *(ulong *)((long)&pVVar14[sVar6].field_0 + 8) = CONCAT44(fStack_4c,fStack_50);
                      dP = local_60;
                      local_80.size_active = uVar1;
                    }
                    std::
                    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    ::
                    emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                              ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                                *)(plVar7 + 0xe),
                               (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                *)&local_80);
                    alignedFree(local_80.items);
                    (**(code **)(*plVar7 + 0x18))();
                  }
                }
                else {
                  (**(code **)(*plVar7 + 0x10))(plVar7);
                  local_80.items = (Vec3fx *)0x0;
                  local_80.size_active = 0;
                  local_80.size_alloced = 0;
                  pfVar15 = *(float **)(plVar7[0x10] + -8);
                  pfVar10 = pfVar15 + *(long *)(plVar7[0x10] + -0x18) * 4;
                  pVVar14 = (Vec3fx *)0x0;
                  uVar11 = 0;
                  for (; sVar6 = local_80.size_active, pfVar15 != pfVar10; pfVar15 = pfVar15 + 4) {
                    local_58 = (dP->field_0).m128[0] + *pfVar15;
                    fStack_54 = (dP->field_0).m128[1] + pfVar15[1];
                    fStack_50 = (dP->field_0).m128[2] + pfVar15[2];
                    fStack_4c = pfVar15[3] + 0.0;
                    uVar1 = local_80.size_active + 1;
                    if (uVar11 < uVar1) {
                      uVar12 = uVar11;
                      uVar13 = uVar1;
                      if (uVar11 != 0) {
                        for (; uVar13 = uVar12, uVar12 < uVar1;
                            uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
                        }
                      }
                      if (uVar11 != uVar13) {
                        pVVar8 = (Vec3fx *)alignedMalloc(uVar13 << 4,0x10);
                        lVar9 = 0;
                        for (uVar11 = 0; uVar11 < sVar6; uVar11 = uVar11 + 1) {
                          puVar2 = (undefined8 *)((long)&pVVar14->field_0 + lVar9);
                          uVar5 = puVar2[1];
                          puVar3 = (undefined8 *)((long)&pVVar8->field_0 + lVar9);
                          *puVar3 = *puVar2;
                          puVar3[1] = uVar5;
                          lVar9 = lVar9 + 0x10;
                        }
                        local_80.items = pVVar8;
                        alignedFree(pVVar14);
                        uVar11 = uVar13;
                        pVVar14 = pVVar8;
                        local_80.size_alloced = uVar13;
                      }
                    }
                    *(ulong *)&pVVar14[sVar6].field_0 = CONCAT44(fStack_54,local_58);
                    *(ulong *)((long)&pVVar14[sVar6].field_0 + 8) = CONCAT44(fStack_4c,fStack_50);
                    dP = local_60;
                    local_80.size_active = uVar1;
                  }
                  std::
                  vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  ::
                  emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                            ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                              *)(plVar7 + 0xf),&local_80);
                  if ((value_type *)plVar7[0x13] != (value_type *)plVar7[0x12]) {
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                 *)(plVar7 + 0x12),(value_type *)plVar7[0x12]);
                  }
                  alignedFree(local_80.items);
                  (**(code **)(*plVar7 + 0x18))(plVar7);
                }
              }
              else {
                (**(code **)(*plVar7 + 0x10))(plVar7);
                local_80.items = (Vec3fx *)0x0;
                local_80.size_active = 0;
                local_80.size_alloced = 0;
                pfVar15 = *(float **)(plVar7[0x10] + -8);
                pfVar10 = pfVar15 + *(long *)(plVar7[0x10] + -0x18) * 4;
                pVVar14 = (Vec3fx *)0x0;
                uVar11 = 0;
                for (; sVar6 = local_80.size_active, pfVar15 != pfVar10; pfVar15 = pfVar15 + 4) {
                  local_58 = (dP->field_0).m128[0] + *pfVar15;
                  fStack_54 = (dP->field_0).m128[1] + pfVar15[1];
                  fStack_50 = (dP->field_0).m128[2] + pfVar15[2];
                  fStack_4c = pfVar15[3] + 0.0;
                  uVar1 = local_80.size_active + 1;
                  if (uVar11 < uVar1) {
                    uVar12 = uVar11;
                    uVar13 = uVar1;
                    if (uVar11 != 0) {
                      for (; uVar13 = uVar12, uVar12 < uVar1;
                          uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
                      }
                    }
                    if (uVar11 != uVar13) {
                      pVVar8 = (Vec3fx *)alignedMalloc(uVar13 << 4,0x10);
                      lVar9 = 0;
                      for (uVar11 = 0; uVar11 < sVar6; uVar11 = uVar11 + 1) {
                        puVar2 = (undefined8 *)((long)&pVVar14->field_0 + lVar9);
                        uVar5 = puVar2[1];
                        puVar3 = (undefined8 *)((long)&pVVar8->field_0 + lVar9);
                        *puVar3 = *puVar2;
                        puVar3[1] = uVar5;
                        lVar9 = lVar9 + 0x10;
                      }
                      local_80.items = pVVar8;
                      alignedFree(pVVar14);
                      uVar11 = uVar13;
                      pVVar14 = pVVar8;
                      local_80.size_alloced = uVar13;
                    }
                  }
                  *(ulong *)&pVVar14[sVar6].field_0 = CONCAT44(fStack_54,local_58);
                  *(ulong *)((long)&pVVar14[sVar6].field_0 + 8) = CONCAT44(fStack_4c,fStack_50);
                  dP = local_60;
                  local_80.size_active = uVar1;
                }
                std::
                vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                ::
                emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                          ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                            *)(plVar7 + 0xf),&local_80);
                alignedFree(local_80.items);
                (**(code **)(*plVar7 + 0x18))();
              }
            }
            else {
              (**(code **)(*plVar7 + 0x10))(plVar7);
              local_80.size_active = 0;
              local_80.size_alloced = 0;
              local_80.items = (Vec3fx *)0x0;
              pfVar15 = *(float **)(plVar7[0xf] + -8);
              pfVar10 = pfVar15 + *(long *)(plVar7[0xf] + -0x18) * 4;
              pVVar14 = (Vec3fx *)0x0;
              uVar11 = 0;
              for (; sVar6 = local_80.size_active, pfVar15 != pfVar10; pfVar15 = pfVar15 + 4) {
                local_58 = *pfVar15 + (dP->field_0).m128[0];
                fStack_54 = pfVar15[1] + (dP->field_0).m128[1];
                fStack_50 = pfVar15[2] + (dP->field_0).m128[2];
                fStack_4c = pfVar15[3] + (dP->field_0).m128[3];
                uVar1 = local_80.size_active + 1;
                if (uVar11 < uVar1) {
                  uVar12 = uVar11;
                  uVar13 = uVar1;
                  if (uVar11 != 0) {
                    for (; uVar13 = uVar12, uVar12 < uVar1;
                        uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
                    }
                  }
                  if (uVar11 != uVar13) {
                    pVVar8 = (Vec3fx *)alignedMalloc(uVar13 << 4,0x10);
                    lVar9 = 0;
                    for (uVar11 = 0; uVar11 < sVar6; uVar11 = uVar11 + 1) {
                      puVar2 = (undefined8 *)((long)&pVVar14->field_0 + lVar9);
                      uVar5 = puVar2[1];
                      puVar3 = (undefined8 *)((long)&pVVar8->field_0 + lVar9);
                      *puVar3 = *puVar2;
                      puVar3[1] = uVar5;
                      lVar9 = lVar9 + 0x10;
                    }
                    local_80.items = pVVar8;
                    alignedFree(pVVar14);
                    uVar11 = uVar13;
                    pVVar14 = pVVar8;
                    local_80.size_alloced = uVar13;
                  }
                }
                *(ulong *)&pVVar14[sVar6].field_0 = CONCAT44(fStack_54,local_58);
                *(ulong *)((long)&pVVar14[sVar6].field_0 + 8) = CONCAT44(fStack_4c,fStack_50);
                dP = local_60;
                local_80.size_active = uVar1;
              }
              std::
              vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
              ::
              emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                        ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                          *)(plVar7 + 0xe),
                         (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                          *)&local_80);
              alignedFree(local_80.items);
              (**(code **)(*plVar7 + 0x18))();
            }
          }
          else {
            (**(code **)(*plVar7 + 0x10))(plVar7);
            local_80.size_active = 0;
            local_80.size_alloced = 0;
            local_80.items = (Vec3fx *)0x0;
            pfVar15 = *(float **)(plVar7[0xf] + -8);
            pfVar10 = pfVar15 + *(long *)(plVar7[0xf] + -0x18) * 4;
            pVVar14 = (Vec3fx *)0x0;
            uVar11 = 0;
            for (; sVar6 = local_80.size_active, pfVar15 != pfVar10; pfVar15 = pfVar15 + 4) {
              local_58 = *pfVar15 + (dP->field_0).m128[0];
              fStack_54 = pfVar15[1] + (dP->field_0).m128[1];
              fStack_50 = pfVar15[2] + (dP->field_0).m128[2];
              fStack_4c = pfVar15[3] + (dP->field_0).m128[3];
              uVar1 = local_80.size_active + 1;
              if (uVar11 < uVar1) {
                uVar12 = uVar11;
                uVar13 = uVar1;
                if (uVar11 != 0) {
                  for (; uVar13 = uVar12, uVar12 < uVar1;
                      uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
                  }
                }
                if (uVar11 != uVar13) {
                  pVVar8 = (Vec3fx *)alignedMalloc(uVar13 << 4,0x10);
                  lVar9 = 0;
                  for (uVar11 = 0; uVar11 < sVar6; uVar11 = uVar11 + 1) {
                    puVar2 = (undefined8 *)((long)&pVVar14->field_0 + lVar9);
                    uVar5 = puVar2[1];
                    puVar3 = (undefined8 *)((long)&pVVar8->field_0 + lVar9);
                    *puVar3 = *puVar2;
                    puVar3[1] = uVar5;
                    lVar9 = lVar9 + 0x10;
                  }
                  local_80.items = pVVar8;
                  alignedFree(pVVar14);
                  uVar11 = uVar13;
                  pVVar14 = pVVar8;
                  local_80.size_alloced = uVar13;
                }
              }
              *(ulong *)&pVVar14[sVar6].field_0 = CONCAT44(fStack_54,local_58);
              *(ulong *)((long)&pVVar14[sVar6].field_0 + 8) = CONCAT44(fStack_4c,fStack_50);
              dP = local_60;
              local_80.size_active = uVar1;
            }
            std::
            vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
            ::
            emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                      ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                        *)(plVar7 + 0xe),
                       (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *
                       )&local_80);
            alignedFree(local_80.items);
            (**(code **)(*plVar7 + 0x18))();
          }
        }
        else {
          (**(code **)(*plVar7 + 0x10))(plVar7);
          local_80.size_active = 0;
          local_80.size_alloced = 0;
          local_80.items = (Vec3fx *)0x0;
          pfVar15 = *(float **)(plVar7[0xf] + -8);
          pfVar10 = pfVar15 + *(long *)(plVar7[0xf] + -0x18) * 4;
          pVVar14 = (Vec3fx *)0x0;
          uVar11 = 0;
          for (; sVar6 = local_80.size_active, pfVar15 != pfVar10; pfVar15 = pfVar15 + 4) {
            local_58 = *pfVar15 + (dP->field_0).m128[0];
            fStack_54 = pfVar15[1] + (dP->field_0).m128[1];
            fStack_50 = pfVar15[2] + (dP->field_0).m128[2];
            fStack_4c = pfVar15[3] + (dP->field_0).m128[3];
            uVar1 = local_80.size_active + 1;
            if (uVar11 < uVar1) {
              uVar12 = uVar11;
              uVar13 = uVar1;
              if (uVar11 != 0) {
                for (; uVar13 = uVar12, uVar12 < uVar1;
                    uVar12 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0)) {
                }
              }
              if (uVar11 != uVar13) {
                pVVar8 = (Vec3fx *)alignedMalloc(uVar13 << 4,0x10);
                lVar9 = 0;
                for (uVar11 = 0; uVar11 < sVar6; uVar11 = uVar11 + 1) {
                  puVar2 = (undefined8 *)((long)&pVVar14->field_0 + lVar9);
                  uVar5 = puVar2[1];
                  puVar3 = (undefined8 *)((long)&pVVar8->field_0 + lVar9);
                  *puVar3 = *puVar2;
                  puVar3[1] = uVar5;
                  lVar9 = lVar9 + 0x10;
                }
                local_80.items = pVVar8;
                alignedFree(pVVar14);
                pVVar14 = pVVar8;
                uVar11 = uVar13;
                local_80.size_alloced = uVar13;
              }
            }
            *(ulong *)&pVVar14[sVar6].field_0 = CONCAT44(fStack_54,local_58);
            *(ulong *)((long)&pVVar14[sVar6].field_0 + 8) = CONCAT44(fStack_4c,fStack_50);
            dP = local_60;
            local_80.size_active = uVar1;
          }
          std::
          vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
          ::
          emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                    ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                      *)(plVar7 + 0xe),
                     (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                     &local_80);
          alignedFree(local_80.items);
          (**(code **)(*plVar7 + 0x18))();
        }
      }
      else {
        (**(code **)(*plVar7 + 0x10))(plVar7);
        for (uVar11 = 0; uVar11 < (ulong)(plVar7[0xe] - plVar7[0xd] >> 3); uVar11 = uVar11 + 1) {
          pNVar4 = *(Node **)(plVar7[0xd] + uVar11 * 8);
          local_40.ptr = pNVar4;
          if (pNVar4 != (Node *)0x0) {
            (*(pNVar4->super_RefCount)._vptr_RefCount[2])(pNVar4);
          }
          set_motion_vector(&local_40,dP);
          if (pNVar4 != (Node *)0x0) {
            (*(pNVar4->super_RefCount)._vptr_RefCount[3])(pNVar4);
          }
        }
        (**(code **)(*plVar7 + 0x18))(plVar7);
      }
    }
    else {
      (**(code **)(*plVar7 + 0x10))(plVar7);
      pNVar4 = (Node *)plVar7[0x13];
      local_38.ptr = pNVar4;
      if (pNVar4 != (Node *)0x0) {
        (*(pNVar4->super_RefCount)._vptr_RefCount[2])(pNVar4);
      }
      set_motion_vector(&local_38,dP);
      if (pNVar4 != (Node *)0x0) {
        (*(pNVar4->super_RefCount)._vptr_RefCount[3])(pNVar4);
      }
      (**(code **)(*plVar7 + 0x18))(plVar7);
    }
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::print(std::ostream& cout, int depth) {
    cout << "HairSetNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }